

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int al_ustr_find_set(ALLEGRO_USTR *us,int start_pos,ALLEGRO_USTR *accept)

{
  _Bool _Var1;
  int32_t c_00;
  size_t sVar2;
  ALLEGRO_USTR *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int set_pos;
  int pos;
  int32_t d;
  int32_t c;
  int rc;
  int local_38;
  int iVar3;
  int32_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  _Var1 = all_ascii(in_RDX);
  if (_Var1) {
    local_38 = _al_binchr((_al_const_bstring)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (int)((ulong)in_RDI >> 0x20),
                          (_al_const_bstring)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    if (local_38 == -1) {
      local_38 = -1;
    }
  }
  else {
    iVar3 = 0;
    while (c_00 = al_ustr_get((ALLEGRO_USTR *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (int)((ulong)in_RDI >> 0x20)), c_00 != -1) {
      if (c_00 == -2) {
        iVar3 = iVar3 + 1;
      }
      else {
        while (in_stack_ffffffffffffffd4 =
                    al_ustr_get_next((ALLEGRO_USTR *)CONCAT44(in_stack_ffffffffffffffdc,c_00),
                                     (int *)CONCAT44(in_stack_ffffffffffffffd4,iVar3)),
              in_stack_ffffffffffffffd4 != -1) {
          if (c_00 == in_stack_ffffffffffffffd4) {
            return iVar3;
          }
        }
        sVar2 = al_utf8_width(c_00);
        iVar3 = iVar3 + (int)sVar2;
      }
    }
    local_38 = -1;
  }
  return local_38;
}

Assistant:

int al_ustr_find_set(const ALLEGRO_USTR *us, int start_pos,
   const ALLEGRO_USTR *accept)
{
   int rc;
   int32_t c, d;
   int pos;
   int set_pos;

   /* Fast path for ASCII characters. */
   if (all_ascii(accept)) {
      rc = _al_binchr(us, start_pos, accept);
      return (rc == _AL_BSTR_ERR) ? -1 : rc;
   }

   /* Non-ASCII. */
   pos = 0;
   while ((c = al_ustr_get(us, pos)) != -1) {
      if (c == -2) {
         /* Invalid byte sequence. */
         pos++;
         continue;
      }

      set_pos = 0;
      while ((d = al_ustr_get_next(accept, &set_pos)) != -1) {
         if (c == d)
            return pos;
      }

      pos += al_utf8_width(c);
   }

   return -1;
}